

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  ImVec2 mx;
  ImRect *this;
  bool bVar1;
  ImRect *in_RCX;
  int *in_RDX;
  float *in_RSI;
  ImVec2 *in_RDI;
  float *in_R8;
  int in_R9D;
  float fVar2;
  float avail_h;
  float avail_w;
  ImGuiDir dir_1;
  int n_1;
  ImGuiDir dir_prefered_order_1 [4];
  ImGuiDir dir;
  int n;
  ImGuiDir dir_prefered_order [4];
  ImVec2 base_pos_clamped;
  ImVec2 pos;
  ImVec2 *in_stack_fffffffffffffed8;
  ImVec2 *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float local_100;
  float local_fc;
  float local_f4;
  float local_f0;
  float local_e8;
  int local_e4;
  int local_d4;
  ImVec2 local_c0;
  float local_b8;
  float local_b4;
  int local_b0;
  int local_ac;
  int local_a8 [4];
  ImVec2 local_98;
  ImRect local_90;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  int local_60;
  int local_5c;
  int local_58 [5];
  ImVec2 local_44;
  ImVec2 local_3c;
  int local_34;
  float *local_30;
  ImRect *local_28;
  int *local_20;
  float *local_18;
  ImVec2 *local_10;
  ImVec2 local_8;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_44 = operator-(in_stack_fffffffffffffed8,(ImVec2 *)0x1431f2);
  mx.y = in_stack_fffffffffffffefc;
  mx.x = in_stack_fffffffffffffef8;
  local_3c = ImClamp((ImVec2 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,mx);
  if (local_34 == 1) {
    local_58[0] = 3;
    local_58[1] = 1;
    local_58[2] = 0;
    local_58[3] = 2;
    local_5c = 0;
    if (*local_20 != -1) {
      local_5c = -1;
    }
    for (; local_5c < 4; local_5c = local_5c + 1) {
      if (local_5c == -1) {
        local_d4 = *local_20;
      }
      else {
        local_d4 = local_58[local_5c];
      }
      local_60 = local_d4;
      if ((local_5c == -1) || (local_d4 != *local_20)) {
        ImVec2::ImVec2(&local_8);
        if (local_60 == 3) {
          ImVec2::ImVec2(&local_68,*local_30,local_30[3]);
          local_8 = local_68;
        }
        if (local_60 == 1) {
          ImVec2::ImVec2(&local_70,*local_30,local_30[1] - local_18[1]);
          local_8 = local_70;
        }
        if (local_60 == 0) {
          ImVec2::ImVec2(&local_78,local_30[2] - *local_18,local_30[3]);
          local_8 = local_78;
        }
        if (local_60 == 2) {
          ImVec2::ImVec2(&local_80,local_30[2] - *local_18,local_30[1] - local_18[1]);
          local_8 = local_80;
        }
        this = local_28;
        local_98 = operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x143431);
        ImRect::ImRect(&local_90,&local_8,&local_98);
        bVar1 = ImRect::Contains(this,&local_90);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          *local_20 = local_60;
          return local_8;
        }
      }
    }
  }
  if ((local_34 == 2) || (local_34 == 0)) {
    local_a8[0] = 1;
    local_a8[1] = 3;
    local_a8[2] = 2;
    local_a8[3] = 0;
    local_ac = 0;
    if (*local_20 != -1) {
      local_ac = -1;
    }
    for (; local_ac < 4; local_ac = local_ac + 1) {
      if (local_ac == -1) {
        local_e4 = *local_20;
      }
      else {
        local_e4 = local_a8[local_ac];
      }
      local_b0 = local_e4;
      if ((local_ac == -1) || (local_e4 != *local_20)) {
        if (local_e4 == 0) {
          local_e8 = *local_30;
        }
        else {
          local_e8 = (local_28->Max).x;
        }
        if (local_e4 == 1) {
          local_f0 = local_30[2];
        }
        else {
          local_f0 = (local_28->Min).x;
        }
        local_b4 = local_e8 - local_f0;
        if (local_e4 == 2) {
          local_f4 = local_30[1];
        }
        else {
          local_f4 = (local_28->Max).y;
        }
        if (local_e4 == 3) {
          local_fc = local_30[3];
        }
        else {
          local_fc = (local_28->Min).y;
        }
        local_b8 = local_f4 - local_fc;
        if (((*local_18 <= local_b4) || ((local_e4 != 0 && (local_e4 != 1)))) &&
           ((local_18[1] <= local_b8 || ((local_e4 != 2 && (local_e4 != 3)))))) {
          ImVec2::ImVec2(&local_8);
          if (local_b0 == 0) {
            local_100 = *local_30 - *local_18;
          }
          else if (local_b0 == 1) {
            local_100 = local_30[2];
          }
          else {
            local_100 = local_3c.x;
          }
          if (local_b0 == 2) {
            local_8.y = local_30[1] - local_18[1];
          }
          else if (local_b0 == 3) {
            local_8.y = local_30[3];
          }
          else {
            local_8.y = local_3c.y;
          }
          local_8.x = local_100;
          local_8.x = ImMax<float>(local_100,(local_28->Min).x);
          fVar2 = ImMax<float>(local_8.y,(local_28->Min).y);
          local_8.y = fVar2;
          *local_20 = local_b0;
          return local_8;
        }
      }
    }
  }
  *local_20 = -1;
  if (local_34 == 2) {
    ImVec2::ImVec2(&local_c0,2.0,2.0);
    local_8 = operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x14383e);
  }
  else {
    local_8 = *local_10;
    fVar2 = ImMin<float>(local_8.x + *local_18,(local_28->Max).x);
    fVar2 = ImMax<float>(fVar2 - *local_18,(local_28->Min).x);
    local_8.x = fVar2;
    fVar2 = ImMin<float>(local_8.y + local_18[1],(local_28->Max).y);
    fVar2 = ImMax<float>(fVar2 - local_18[1],(local_28->Min).y);
    local_8.y = fVar2;
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Tooltip and Default popup policy
    // (Always first try the direction we used on the last frame, if any)
    if (policy == ImGuiPopupPositionPolicy_Tooltip || policy == ImGuiPopupPositionPolicy_Default)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;

            const float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
            const float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);

            // If there not enough room on one axis, there's no point in positioning on a side on this axis (e.g. when not enough width, use a top/bottom position to maximize available width)
            if (avail_w < size.x && (dir == ImGuiDir_Left || dir == ImGuiDir_Right))
                continue;
            if (avail_h < size.y && (dir == ImGuiDir_Up || dir == ImGuiDir_Down))
                continue;

            ImVec2 pos;
            pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
            pos.y = (dir == ImGuiDir_Up) ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down) ? r_avoid.Max.y : base_pos_clamped.y;

            // Clamp top-left corner of popup
            pos.x = ImMax(pos.x, r_outer.Min.x);
            pos.y = ImMax(pos.y, r_outer.Min.y);

            *last_dir = dir;
            return pos;
        }
    }

    // Fallback when not enough room:
    *last_dir = ImGuiDir_None;

    // For tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
    if (policy == ImGuiPopupPositionPolicy_Tooltip)
        return ref_pos + ImVec2(2, 2);

    // Otherwise try to keep within display
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}